

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polyfit.h
# Opt level: O1

void __thiscall PolyFit<double>::solveRLS(PolyFit<double> *this)

{
  double *pdVar1;
  double *pdVar2;
  int iVar3;
  double *pdVar4;
  bool bVar5;
  Index index;
  ulong uVar6;
  long lVar7;
  undefined8 *puVar8;
  long lVar9;
  Index index_1;
  ulong uVar10;
  ActualDstType actualDst;
  Index size;
  int iVar11;
  int iVar12;
  double dVar13;
  double __x;
  double extraout_XMM0_Qa;
  undefined1 auVar14 [16];
  SrcEvaluatorType srcEvaluator;
  vector<int,_std::allocator<int>_> inliers;
  vector<int,_std::allocator<int>_> bestSubset;
  set<int,_std::less<int>,_std::allocator<int>_> indexSet;
  void *local_b8;
  vector<int,_std::allocator<int>_> local_a8;
  vector<int,_std::allocator<int>_> local_88;
  double local_68;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  dVar13 = 0.0;
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  iVar11 = 1;
  uVar10 = 0;
  local_b8 = (void *)0x0;
  iVar12 = 0;
  do {
    if (iVar11 <= iVar12) break;
    logging::log(&logger,dVar13);
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    randsample(this,(int)((ulong)((long)(this->y->
                                        super__Vector_base<double,_std::allocator<double>_>)._M_impl
                                        .super__Vector_impl_data._M_finish -
                                 (long)(this->y->super__Vector_base<double,_std::allocator<double>_>
                                       )._M_impl.super__Vector_impl_data._M_start) >> 3) + -1,
               this->options->maxMPts,(set<int,_std::less<int>,_std::allocator<int>_> *)&local_60);
    if (this->options->maxMPts != (int)local_60._M_impl.super__Rb_tree_header._M_node_count) {
      __assert_fail("static_cast<int>(indexSet.size()) == options.maxMPts",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rkwitt[P]polyran/src/polyfit.h"
                    ,0x118,"void PolyFit<double>::solveRLS() [T = double]");
    }
    dataToEigenSubset(this,(set<int,_std::less<int>,_std::allocator<int>_> *)&local_60);
    buildV(this);
    dVar13 = solveLS(this);
    logging::log(&logger,dVar13);
    local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    getInliers(this,&local_a8);
    dVar13 = logging::log(&logger,__x);
    if ((ulong)((long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start) <
        (ulong)((long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start)) {
      std::vector<int,_std::allocator<int>_>::operator=(&local_88,&local_a8);
      pdVar4 = (this->pCoef).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_data;
      uVar6 = (this->pCoef).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
              .m_rows;
      if (uVar10 != uVar6) {
        if ((long)uVar6 < 0) goto LAB_0010bea7;
        free(local_b8);
        uVar10 = uVar6;
        if (uVar6 == 0) {
          local_b8 = (void *)0x0;
        }
        else {
          if (uVar6 >> 0x3d != 0) {
LAB_0010be79:
            puVar8 = (undefined8 *)__cxa_allocate_exception(8);
            *puVar8 = operator_new;
            __cxa_throw(puVar8,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
          }
          local_b8 = malloc(uVar6 * 8);
          if (uVar6 != 1 && ((ulong)local_b8 & 0xf) != 0) {
            __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                          ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                          "void *Eigen::internal::aligned_malloc(std::size_t)");
          }
          if (local_b8 == (void *)0x0) goto LAB_0010be79;
        }
      }
      if (uVar10 != uVar6) goto LAB_0010be5a;
      uVar6 = uVar10 - ((long)uVar10 >> 0x3f) & 0xfffffffffffffffe;
      if (1 < (long)uVar10) {
        lVar9 = 0;
        do {
          pdVar2 = pdVar4 + lVar9;
          dVar13 = pdVar2[1];
          pdVar1 = (double *)((long)local_b8 + lVar9 * 8);
          *pdVar1 = *pdVar2;
          pdVar1[1] = dVar13;
          lVar9 = lVar9 + 2;
        } while (lVar9 < (long)uVar6);
      }
      if ((long)uVar6 < (long)uVar10) {
        do {
          *(double *)((long)local_b8 + uVar6 * 8) = pdVar4[uVar6];
          uVar6 = uVar6 + 1;
        } while (uVar10 != uVar6);
      }
      lVar7 = (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2;
      auVar14._8_4_ =
           (int)((long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start >> 0x22);
      auVar14._0_8_ = lVar7;
      auVar14._12_4_ = 0x45300000;
      lVar9 = (this->yM).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows;
      local_68 = (double)__powidf2(this->options->maxMPts);
      local_68 = 1.0 - local_68;
      if (local_68 <= 1e-09) {
        local_68 = 1e-09;
      }
      if (0.999999999 <= local_68) {
        local_68 = 0.999999999;
      }
      dVar13 = log(local_68);
      iVar11 = (int)(-4.605170185988091 / dVar13);
      dVar13 = logging::log(&logger,(((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)
                                    + (auVar14._8_8_ - 1.9342813113834067e+25)) / (double)lVar9);
    }
    iVar3 = this->options->maxTrial;
    if (iVar3 <= iVar12) {
      logging::log(&logger,dVar13);
    }
    if (local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&local_60);
    bVar5 = iVar12 < iVar3;
    iVar12 = iVar12 + 1;
    dVar13 = extraout_XMM0_Qa;
  } while (bVar5);
  if ((this->pCoef).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
      != uVar10) {
    if ((long)uVar10 < 0) {
LAB_0010bea7:
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                   );
    }
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
              ((DenseStorage<double,__1,__1,_1,_0> *)&this->pCoef,uVar10,uVar10,1);
  }
  uVar6 = (this->pCoef).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows;
  if (uVar6 == uVar10) {
    pdVar4 = (this->pCoef).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data;
    uVar10 = uVar6 - ((long)uVar6 >> 0x3f) & 0xfffffffffffffffe;
    if (1 < (long)uVar6) {
      lVar9 = 0;
      do {
        pdVar2 = (double *)((long)local_b8 + lVar9 * 8);
        dVar13 = pdVar2[1];
        pdVar1 = pdVar4 + lVar9;
        *pdVar1 = *pdVar2;
        pdVar1[1] = dVar13;
        lVar9 = lVar9 + 2;
      } while (lVar9 < (long)uVar10);
    }
    if ((long)uVar10 < (long)uVar6) {
      do {
        pdVar4[uVar10] = *(double *)((long)local_b8 + uVar10 * 8);
        uVar10 = uVar10 + 1;
      } while (uVar6 != uVar10);
    }
    free(local_b8);
    if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    return;
  }
LAB_0010be5a:
  __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, T1 = double, T2 = double]"
               );
}

Assistant:

void solveRLS(void)
    {
      std::vector<int> bestSubset;
      Eigen::Matrix<T, Eigen::Dynamic, 1> bestCoef;
      
      // Probability that we can at least choose
      // one sample with options.maxMPts free of
      // outliers (sugg. by Peter Kovesi's code)
      double p = 0.99;

      int trialCount = 0; int N = 1;
      while (N > trialCount)
      {
        logger.log(DEBUG, "[%s]: Trial %d\n",
            __func__, trialCount);

        std::set<int> indexSet;
        randsample(static_cast<int>(y.size()-1),
            options.maxMPts, indexSet);

        assert(static_cast<int>(indexSet.size()) == options.maxMPts);

        // Build (sample,signal) for current subset
        dataToEigenSubset(indexSet);
        buildV();
        
        // Solve the LS-fitting problem
        double mse = solveLS();
         logger.log(DEBUG, "[%s]: MSE=%.8f in %d-th RLS trial\n",
            __func__, mse, trialCount);

        // Compute inlier indices
        std::vector<int> inliers;
        int nInliers = getInliers(inliers);    

        logger.log(DEBUG, "[%s]: #Inliers = %d\n",
            __func__, nInliers);

        if (inliers.size() > bestSubset.size())
        {
          // Store settings
          bestSubset = inliers;
          bestCoef = pCoef;

          // Refine estimate of N (based on Peter Kovesi's MATLAB impl. of RANSAC)
          double fracInliers = static_cast<double>(inliers.size())/double(yM.rows());
          double pNoOutliers = 1 - pow(fracInliers,options.maxMPts);
          pNoOutliers = std::max(1e-9, pNoOutliers);  
          pNoOutliers = std::min(1-1e-9, pNoOutliers);
          N = log(1-p)/log(pNoOutliers);

          logger.log(DEBUG, "[%s]: Inlier fraction=%.2f, P(Choose no outlier)=%.2f --> N=%d\n",
              __func__, fracInliers, pNoOutliers, N);
        }

        ++trialCount;
        if (trialCount > options.maxTrial)
        {
          logger.log(WARNING, "[%s]: Maximum nr. of trials (%d) reached!\n",
              __func__, options.maxTrial);
          break;
        }
      }
      pCoef = bestCoef;
    }